

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tags.c
# Opt level: O0

int tagsvisit(int f,int n)

{
  int iVar1;
  ulong uVar2;
  char **local_428;
  char *temp;
  char *bufp;
  char fname [1024];
  int n_local;
  int f_local;
  
  fname._1020_4_ = n;
  iVar1 = getbufcwd((char *)&bufp,0x400);
  if (iVar1 == 0) {
    bufp._0_1_ = 0;
  }
  uVar2 = strlcat(&bufp,"tags",0x400);
  if (uVar2 < 0x400) {
    local_428 = (char **)eread("Visit tags table (default %s): ",(char *)&bufp,0x400,0x3c,"tags");
    if (local_428 == (char **)0x0) {
      n_local = 2;
    }
    else {
      if ((tags.rbh_root != (ctag *)0x0) &&
         (iVar1 = eyorn("Keep current list of tags table also"), iVar1 == 0)) {
        ewprintf("Starting a new list of tags table");
        unloadtags();
      }
      if (*(char *)local_428 == '\0') {
        local_428 = &bufp;
      }
      n_local = loadtags((char *)local_428);
    }
  }
  else {
    dobeep();
    ewprintf("Filename too long");
    n_local = 0;
  }
  return n_local;
}

Assistant:

int
tagsvisit(int f, int n)
{
	char fname[NFILEN], *bufp, *temp;

	if (getbufcwd(fname, sizeof(fname)) == FALSE)
		fname[0] = '\0';

	if (strlcat(fname, DEFAULTFN, sizeof(fname)) >= sizeof(fname)) {
		dobeep();
		ewprintf("Filename too long");
		return (FALSE);
	}

	bufp = eread("Visit tags table (default %s): ", fname,
	    NFILEN, EFFILE | EFCR | EFNEW | EFDEF, DEFAULTFN);
	if (bufp == NULL)
		return (ABORT);

	if (!RB_EMPTY(&tags)) {
		if (eyorn("Keep current list of tags table also") == FALSE) {
			ewprintf("Starting a new list of tags table");
			unloadtags();
		}
	}

	temp = bufp;
	if (temp[0] == '\0')
		temp = fname;

	return (loadtags(temp));
}